

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O3

void free_D_Grammar(Grammar *g)

{
  Production *__ptr;
  Rule *r;
  Elem *__ptr_00;
  Rule **__ptr_01;
  Production **__ptr_02;
  Term *__ptr_03;
  Term **__ptr_04;
  Action **ppAVar1;
  char *__ptr_05;
  State *__ptr_06;
  Item **ppIVar2;
  Goto **__ptr_07;
  Hint **ppHVar3;
  State **__ptr_08;
  Declaration **__ptr_09;
  D_Pass **__ptr_10;
  ScanState **ppSVar4;
  ScanStateTransition **ppSVar5;
  uint uVar6;
  ScanState *pSVar7;
  ScanStateTransition *pSVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  
  if ((g->productions).n != 0) {
    uVar10 = 0;
    do {
      __ptr = (g->productions).v[uVar10];
      if ((__ptr->rules).n != 0) {
        uVar11 = 0;
        do {
          r = (__ptr->rules).v[uVar11];
          if (r == g->r) {
            g->r = (Rule *)0x0;
          }
          if ((r->elems).n != 0) {
            uVar9 = 0;
            do {
              __ptr_00 = (r->elems).v[uVar9];
              if (__ptr_00 == __ptr->elem) {
                __ptr->elem = (Elem *)0x0;
              }
              free(__ptr_00);
              uVar9 = uVar9 + 1;
            } while (uVar9 < (r->elems).n);
          }
          if (r->end == __ptr->elem) {
            __ptr->elem = (Elem *)0x0;
          }
          free_rule(r);
          uVar11 = uVar11 + 1;
        } while (uVar11 < (__ptr->rules).n);
      }
      __ptr_01 = (__ptr->rules).v;
      if (__ptr_01 != (__ptr->rules).e && __ptr_01 != (Rule **)0x0) {
        free(__ptr_01);
      }
      (__ptr->rules).n = 0;
      (__ptr->rules).v = (Rule **)0x0;
      free(__ptr->name);
      if (__ptr->elem != (Elem *)0x0) {
        free_rule(__ptr->elem->rule);
        free(__ptr->elem);
      }
      free(__ptr);
      uVar10 = uVar10 + 1;
    } while (uVar10 < (g->productions).n);
  }
  __ptr_02 = (g->productions).v;
  if (__ptr_02 != (g->productions).e && __ptr_02 != (Production **)0x0) {
    free(__ptr_02);
  }
  (g->productions).n = 0;
  (g->productions).v = (Production **)0x0;
  if ((g->terminals).n != 0) {
    uVar10 = 0;
    do {
      __ptr_03 = (g->terminals).v[uVar10];
      if (__ptr_03->string != (char *)0x0) {
        free(__ptr_03->string);
      }
      if (__ptr_03->term_name != (char *)0x0) {
        free(__ptr_03->term_name);
      }
      free(__ptr_03);
      uVar10 = uVar10 + 1;
    } while (uVar10 < (g->terminals).n);
  }
  __ptr_04 = (g->terminals).v;
  if (__ptr_04 != (g->terminals).e && __ptr_04 != (Term **)0x0) {
    free(__ptr_04);
  }
  (g->terminals).n = 0;
  (g->terminals).v = (Term **)0x0;
  if ((g->actions).n != 0) {
    uVar10 = 0;
    do {
      free_Action((g->actions).v[uVar10]);
      uVar10 = uVar10 + 1;
    } while (uVar10 < (g->actions).n);
  }
  ppAVar1 = (g->actions).v;
  if (ppAVar1 != (g->actions).e && ppAVar1 != (Action **)0x0) {
    free(ppAVar1);
  }
  (g->actions).n = 0;
  (g->actions).v = (Action **)0x0;
  __ptr_05 = (g->scanner).code;
  if (__ptr_05 != (char *)0x0) {
    free(__ptr_05);
  }
  if ((g->states).n != 0) {
    uVar10 = 0;
    do {
      __ptr_06 = (g->states).v[uVar10];
      ppIVar2 = (__ptr_06->items).v;
      if (ppIVar2 != (__ptr_06->items).e && ppIVar2 != (Item **)0x0) {
        free(ppIVar2);
      }
      (__ptr_06->items).n = 0;
      (__ptr_06->items).v = (Item **)0x0;
      ppIVar2 = (__ptr_06->items_hash).v;
      if (ppIVar2 != (__ptr_06->items_hash).e && ppIVar2 != (Item **)0x0) {
        free(ppIVar2);
      }
      (__ptr_06->items_hash).n = 0;
      (__ptr_06->items_hash).v = (Item **)0x0;
      if ((__ptr_06->gotos).n != 0) {
        uVar11 = 0;
        do {
          free((__ptr_06->gotos).v[uVar11]->elem);
          free((__ptr_06->gotos).v[uVar11]);
          uVar11 = uVar11 + 1;
        } while (uVar11 < (__ptr_06->gotos).n);
      }
      __ptr_07 = (__ptr_06->gotos).v;
      if (__ptr_07 != (__ptr_06->gotos).e && __ptr_07 != (Goto **)0x0) {
        free(__ptr_07);
      }
      (__ptr_06->gotos).n = 0;
      (__ptr_06->gotos).v = (Goto **)0x0;
      ppAVar1 = (__ptr_06->shift_actions).v;
      if (ppAVar1 != (__ptr_06->shift_actions).e && ppAVar1 != (Action **)0x0) {
        free(ppAVar1);
      }
      (__ptr_06->shift_actions).n = 0;
      (__ptr_06->shift_actions).v = (Action **)0x0;
      ppAVar1 = (__ptr_06->reduce_actions).v;
      if (ppAVar1 != (__ptr_06->reduce_actions).e && ppAVar1 != (Action **)0x0) {
        free(ppAVar1);
      }
      (__ptr_06->reduce_actions).n = 0;
      (__ptr_06->reduce_actions).v = (Action **)0x0;
      if ((__ptr_06->right_epsilon_hints).n != 0) {
        uVar11 = 0;
        do {
          free((__ptr_06->right_epsilon_hints).v[uVar11]);
          uVar11 = uVar11 + 1;
        } while (uVar11 < (__ptr_06->right_epsilon_hints).n);
      }
      ppHVar3 = (__ptr_06->right_epsilon_hints).v;
      if (ppHVar3 != (__ptr_06->right_epsilon_hints).e && ppHVar3 != (Hint **)0x0) {
        free(ppHVar3);
      }
      (__ptr_06->right_epsilon_hints).n = 0;
      (__ptr_06->right_epsilon_hints).v = (Hint **)0x0;
      if ((__ptr_06->error_recovery_hints).n != 0) {
        uVar11 = 0;
        do {
          free((__ptr_06->error_recovery_hints).v[uVar11]);
          uVar11 = uVar11 + 1;
        } while (uVar11 < (__ptr_06->error_recovery_hints).n);
      }
      ppHVar3 = (__ptr_06->error_recovery_hints).v;
      if (ppHVar3 != (__ptr_06->error_recovery_hints).e && ppHVar3 != (Hint **)0x0) {
        free(ppHVar3);
      }
      (__ptr_06->error_recovery_hints).n = 0;
      (__ptr_06->error_recovery_hints).v = (Hint **)0x0;
      if (__ptr_06->same_shifts == (State *)0x0) {
        if ((__ptr_06->scanner).states.n != 0) {
          uVar11 = 0;
          do {
            ppSVar4 = (__ptr_06->scanner).states.v;
            pSVar7 = ppSVar4[uVar11];
            ppAVar1 = (pSVar7->accepts).v;
            if (ppAVar1 != (pSVar7->accepts).e && ppAVar1 != (Action **)0x0) {
              free(ppAVar1);
              ppSVar4 = (__ptr_06->scanner).states.v;
              pSVar7 = ppSVar4[uVar11];
            }
            (pSVar7->accepts).n = 0;
            (pSVar7->accepts).v = (Action **)0x0;
            pSVar7 = ppSVar4[uVar11];
            ppAVar1 = (pSVar7->live).v;
            if (ppAVar1 != (pSVar7->live).e && ppAVar1 != (Action **)0x0) {
              free(ppAVar1);
              ppSVar4 = (__ptr_06->scanner).states.v;
              pSVar7 = ppSVar4[uVar11];
            }
            (pSVar7->live).n = 0;
            (pSVar7->live).v = (Action **)0x0;
            free(ppSVar4[uVar11]);
            uVar11 = uVar11 + 1;
          } while (uVar11 < (__ptr_06->scanner).states.n);
        }
        ppSVar4 = (__ptr_06->scanner).states.v;
        if (ppSVar4 != (__ptr_06->scanner).states.e && ppSVar4 != (ScanState **)0x0) {
          free(ppSVar4);
        }
        (__ptr_06->scanner).states.n = 0;
        (__ptr_06->scanner).states.v = (ScanState **)0x0;
        uVar6 = (__ptr_06->scanner).transitions.n;
        if (uVar6 != 0) {
          uVar11 = 0;
          do {
            ppSVar5 = (__ptr_06->scanner).transitions.v;
            pSVar8 = ppSVar5[uVar11];
            if (pSVar8 != (ScanStateTransition *)0x0) {
              ppAVar1 = (pSVar8->live_diff).v;
              if (ppAVar1 != (pSVar8->live_diff).e && ppAVar1 != (Action **)0x0) {
                free(ppAVar1);
                ppSVar5 = (__ptr_06->scanner).transitions.v;
                pSVar8 = ppSVar5[uVar11];
              }
              (pSVar8->live_diff).n = 0;
              (pSVar8->live_diff).v = (Action **)0x0;
              pSVar8 = ppSVar5[uVar11];
              ppAVar1 = (pSVar8->accepts_diff).v;
              if (ppAVar1 != (pSVar8->accepts_diff).e && ppAVar1 != (Action **)0x0) {
                free(ppAVar1);
                ppSVar5 = (__ptr_06->scanner).transitions.v;
                pSVar8 = ppSVar5[uVar11];
              }
              (pSVar8->accepts_diff).n = 0;
              (pSVar8->accepts_diff).v = (Action **)0x0;
              free(ppSVar5[uVar11]);
              uVar6 = (__ptr_06->scanner).transitions.n;
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar6);
        }
        ppSVar5 = (__ptr_06->scanner).transitions.v;
        if (ppSVar5 != (__ptr_06->scanner).transitions.e && ppSVar5 != (ScanStateTransition **)0x0)
        {
          free(ppSVar5);
        }
        (__ptr_06->scanner).transitions.n = 0;
        (__ptr_06->scanner).transitions.v = (ScanStateTransition **)0x0;
      }
      free(__ptr_06->goto_valid);
      free(__ptr_06);
      uVar10 = uVar10 + 1;
    } while (uVar10 < (g->states).n);
  }
  __ptr_08 = (g->states).v;
  if (__ptr_08 != (g->states).e && __ptr_08 != (State **)0x0) {
    free(__ptr_08);
  }
  (g->states).n = 0;
  (g->states).v = (State **)0x0;
  if (g->ncode != 0) {
    lVar12 = 0;
    uVar10 = 0;
    do {
      free(*(void **)((long)&g->code->code + lVar12));
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + 0x10;
    } while (uVar10 < g->ncode);
  }
  free(g->code);
  if ((g->declarations).n != 0) {
    uVar10 = 0;
    do {
      free((g->declarations).v[uVar10]->elem);
      free((g->declarations).v[uVar10]);
      uVar10 = uVar10 + 1;
    } while (uVar10 < (g->declarations).n);
  }
  __ptr_09 = (g->declarations).v;
  if (__ptr_09 != (g->declarations).e && __ptr_09 != (Declaration **)0x0) {
    free(__ptr_09);
  }
  (g->declarations).n = 0;
  (g->declarations).v = (Declaration **)0x0;
  if ((g->passes).n != 0) {
    uVar10 = 0;
    do {
      free((g->passes).v[uVar10]->name);
      free((g->passes).v[uVar10]);
      uVar10 = uVar10 + 1;
    } while (uVar10 < (g->passes).n);
  }
  __ptr_10 = (g->passes).v;
  if (__ptr_10 != (g->passes).e && __ptr_10 != (D_Pass **)0x0) {
    free(__ptr_10);
  }
  (g->passes).n = 0;
  (g->passes).v = (D_Pass **)0x0;
  if ((g->all_pathnames).n != 0) {
    uVar10 = 0;
    do {
      free((g->all_pathnames).v[uVar10]);
      uVar10 = uVar10 + 1;
    } while (uVar10 < (g->all_pathnames).n);
  }
  free(g->pathname);
  if (g->default_white_space != (char *)0x0) {
    free(g->default_white_space);
  }
  free(g);
  return;
}

Assistant:

void free_D_Grammar(Grammar *g) {
  uint i, j, k;

  for (i = 0; i < g->productions.n; i++) {
    Production *p = g->productions.v[i];
    for (j = 0; j < p->rules.n; j++) {
      Rule *r = p->rules.v[j];
      if (r == g->r) g->r = 0;
      for (k = 0; k < r->elems.n; k++) {
        Elem *e = r->elems.v[k];
        if (e == p->elem) p->elem = 0;
        FREE(e);
      }
      if (r->end == p->elem) p->elem = 0;
      free_rule(r);
    }
    vec_free(&p->rules);
    FREE(p->name);
    if (p->elem) {
      free_rule(p->elem->rule);
      FREE(p->elem);
    }
    FREE(p);
  }
  vec_free(&g->productions);
  for (i = 0; i < g->terminals.n; i++) {
    Term *t = g->terminals.v[i];
    if (t->string) FREE(t->string);
    if (t->term_name) FREE(t->term_name);
    FREE(t);
  }
  vec_free(&g->terminals);
  for (i = 0; i < g->actions.n; i++) free_Action(g->actions.v[i]);
  vec_free(&g->actions);
  if (g->scanner.code) FREE(g->scanner.code);
  for (i = 0; i < g->states.n; i++) {
    State *s = g->states.v[i];
    vec_free(&s->items);
    vec_free(&s->items_hash);
    for (j = 0; j < s->gotos.n; j++) {
      FREE(s->gotos.v[j]->elem);
      FREE(s->gotos.v[j]);
    }
    vec_free(&s->gotos);
    vec_free(&s->shift_actions);
    vec_free(&s->reduce_actions);
    for (j = 0; j < s->right_epsilon_hints.n; j++) FREE(s->right_epsilon_hints.v[j]);
    vec_free(&s->right_epsilon_hints);
    for (j = 0; j < s->error_recovery_hints.n; j++) FREE(s->error_recovery_hints.v[j]);
    vec_free(&s->error_recovery_hints);
    if (!s->same_shifts) {
      for (j = 0; j < s->scanner.states.n; j++) {
        vec_free(&s->scanner.states.v[j]->accepts);
        vec_free(&s->scanner.states.v[j]->live);
        FREE(s->scanner.states.v[j]);
      }
      vec_free(&s->scanner.states);
      for (j = 0; j < s->scanner.transitions.n; j++)
        if (s->scanner.transitions.v[j]) {
          vec_free(&s->scanner.transitions.v[j]->live_diff);
          vec_free(&s->scanner.transitions.v[j]->accepts_diff);
          FREE(s->scanner.transitions.v[j]);
        }
      vec_free(&s->scanner.transitions);
    }
    FREE(s->goto_valid);
    FREE(s);
  }
  vec_free(&g->states);
  for (i = 0; i < g->ncode; i++) FREE(g->code[i].code);
  FREE(g->code);
  for (i = 0; i < g->declarations.n; i++) {
    FREE(g->declarations.v[i]->elem);
    FREE(g->declarations.v[i]);
  }
  vec_free(&g->declarations);
  for (i = 0; i < g->passes.n; i++) {
    FREE(g->passes.v[i]->name);
    FREE(g->passes.v[i]);
  }
  vec_free(&g->passes);
  for (i = 0; i < g->all_pathnames.n; i++) FREE(g->all_pathnames.v[i]);
  FREE(g->pathname);
  if (g->default_white_space) FREE(g->default_white_space);
  FREE(g);
}